

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satProof.c
# Opt level: O1

void Proof_CollectUsed_rec(Vec_Set_t *vProof,int hNode,Vec_Int_t *vUsed)

{
  word *pwVar1;
  uint uVar2;
  uint hNode_00;
  word *pwVar3;
  ulong uVar4;
  
  if (0 < hNode) {
    uVar4 = (ulong)(vProof->uPageMask & hNode);
    if (*(int *)((long)vProof->pPages[(uint)hNode >> ((byte)vProof->nPageSize & 0x1f)] +
                uVar4 * 8 + 4) != 0) {
      return;
    }
    pwVar1 = vProof->pPages[(uint)hNode >> ((byte)vProof->nPageSize & 0x1f)] + uVar4;
    *(uint *)((long)pwVar1 + 4) = 1;
    if (7 < (uint)*pwVar1) {
      uVar4 = 0;
      do {
        uVar2 = *(uint *)((long)pwVar1 + uVar4 * 4 + 8);
        hNode_00 = (int)uVar2 >> 2;
        if ((uVar2 & 1) == 0) {
          if ((int)hNode_00 < 1) goto LAB_0092970f;
          pwVar3 = vProof->pPages[hNode_00 >> ((byte)vProof->nPageSize & 0x1f)] +
                   (hNode_00 & vProof->uPageMask);
        }
        else {
          pwVar3 = (word *)0x0;
        }
        if ((pwVar3 != (word *)0x0) && (*(int *)((long)pwVar3 + 4) == 0)) {
          Proof_CollectUsed_rec(vProof,hNode_00,vUsed);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < (uint)*pwVar1 >> 3);
    }
    Vec_IntPush(vUsed,hNode);
    return;
  }
LAB_0092970f:
  __assert_fail("h > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satProof.c"
                ,0x3a,"satset *Proof_NodeRead(Vec_Set_t *, int)");
}

Assistant:

void Proof_CollectUsed_rec( Vec_Set_t * vProof, int hNode, Vec_Int_t * vUsed )
{
    satset * pNext, * pNode = Proof_NodeRead( vProof, hNode );
    int i;
    if ( pNode->Id )
        return;
    pNode->Id = 1;
    Proof_NodeForeachFanin( vProof, pNode, pNext, i )
        if ( pNext && !pNext->Id )
            Proof_CollectUsed_rec( vProof, pNode->pEnts[i] >> 2, vUsed );
    Vec_IntPush( vUsed, hNode );
}